

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O1

float SoftMaxLoss(vector<float,_std::allocator<float>_> *output,Target classId,
                 vector<float,_std::allocator<float>_> *softMax,
                 vector<float,_std::allocator<float>_> *deltas,float *S)

{
  float *pfVar1;
  iterator iVar2;
  pointer pfVar3;
  float *pfVar4;
  ulong uVar5;
  vector<float,_std::allocator<float>_> *__range1;
  float fVar6;
  float local_70;
  float local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pfVar4 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_68 = 0;
  uStack_60 = 0;
  if (pfVar4 != pfVar1) {
    local_68 = 0;
    uStack_60 = 0;
    do {
      local_6c = expf(*pfVar4);
      iVar2._M_current =
           (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (softMax,iVar2,&local_6c);
      }
      else {
        *iVar2._M_current = local_6c;
        (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar2._M_current + 1;
      }
      local_68 = CONCAT44(local_68._4_4_,
                          (float)local_68 +
                          (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_finish[-1]);
      pfVar4 = pfVar4 + 1;
    } while (pfVar4 != pfVar1);
  }
  local_48 = 0.0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  if ((output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar5 = 0;
    do {
      local_70 = (float)(-(uint)(ABS(classId - (float)(int)uVar5) < 1e-05) & 0x3f800000);
      pfVar3 = (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3[uVar5] = pfVar3[uVar5] / (float)local_68;
      local_58 = ZEXT416((uint)local_70);
      local_70 = pfVar3[uVar5] - local_70;
      iVar2._M_current =
           (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(deltas,iVar2,&local_70)
        ;
      }
      else {
        *iVar2._M_current = local_70;
        (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      pfVar3 = (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *S = pfVar3[uVar5] *
           (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar5] + *S;
      fVar6 = logf(pfVar3[uVar5]);
      local_48 = local_48 + fVar6 * (float)local_58._0_4_;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(output->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(output->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return -local_48;
}

Assistant:

float SoftMaxLoss( const std::vector<float> &output, SPIKING_NN::Target classId,
                   std::vector<float> &softMax, std::vector<float> &deltas, float *S )
{
    float expSum = 0;
    float loss = 0;
    for ( auto activation: output ) {
        // TODO: make some exps on final target (important to understand everything around gradients formulas)
        softMax.emplace_back( exp( activation ));
        expSum += softMax.back();
    }
    for ( int neuronId = 0; neuronId < output.size(); neuronId++ ) {
        auto target = static_cast<float>( abs( classId - neuronId ) < SPIKING_NN::EPS );
        softMax[neuronId] /= expSum;
        deltas.emplace_back( softMax[neuronId] - target );
        *S += softMax[neuronId] * deltas[neuronId];
        loss += target * log( softMax[neuronId] );
    }
    return -loss;
}